

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256.cpp
# Opt level: O1

uint __thiscall base_uint<256U>::bits(base_uint<256U> *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  uVar2 = 7;
  iVar3 = -0xe1;
  do {
    uVar1 = this->pn[uVar2];
    if (uVar1 != 0) {
      uVar2 = 0x1f;
      if (-1 < (int)uVar1) goto LAB_008321be;
      bVar4 = false;
      goto LAB_008321d1;
    }
    iVar3 = iVar3 + 0x20;
    bVar4 = uVar2 != 0;
    uVar2 = uVar2 - 1;
  } while (bVar4);
  uVar2 = 0;
  goto LAB_008321dd;
  while (uVar2 = uVar2 - 1, (uVar1 >> (uVar2 & 0x1f) & 1) == 0) {
LAB_008321be:
    bVar4 = uVar2 < 2;
    if (bVar4) goto LAB_008321d5;
  }
LAB_008321d1:
  uVar2 = uVar2 - iVar3;
LAB_008321d5:
  if (bVar4) {
    uVar2 = -iVar3;
  }
LAB_008321dd:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  return uVar2;
}

Assistant:

unsigned int base_uint<BITS>::bits() const
{
    for (int pos = WIDTH - 1; pos >= 0; pos--) {
        if (pn[pos]) {
            for (int nbits = 31; nbits > 0; nbits--) {
                if (pn[pos] & 1U << nbits)
                    return 32 * pos + nbits + 1;
            }
            return 32 * pos + 1;
        }
    }
    return 0;
}